

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O0

void __thiscall
kratos::Enum::add_debug_info
          (Enum *this,string *enum_name,
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
          *debug)

{
  mapped_type *pmVar1;
  element_type *peVar2;
  undefined1 local_30 [8];
  mapped_type var;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  *debug_local;
  string *enum_name_local;
  Enum *this_local;
  
  var.super___shared_ptr<kratos::EnumConst,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)debug;
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::EnumConst>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::EnumConst>_>_>_>
           ::at(&this->values,enum_name);
  std::shared_ptr<kratos::EnumConst>::shared_ptr((shared_ptr<kratos::EnumConst> *)local_30,pmVar1);
  peVar2 = std::__shared_ptr_access<kratos::EnumConst,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<kratos::EnumConst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_30);
  std::
  vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
  ::emplace_back<std::pair<std::__cxx11::string,unsigned_int>const&>
            ((vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
              *)&(peVar2->super_Const).super_Var.super_IRNode.fn_name_ln,
             (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
              *)var.super___shared_ptr<kratos::EnumConst,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi);
  std::shared_ptr<kratos::EnumConst>::~shared_ptr((shared_ptr<kratos::EnumConst> *)local_30);
  return;
}

Assistant:

void Enum::add_debug_info(const std::string &enum_name,
                          const std::pair<std::string, uint32_t> &debug) {
    auto var = values.at(enum_name);
    var->fn_name_ln.emplace_back(debug);
}